

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DotOut.h
# Opt level: O2

ostream * Hpipe::dot_out<Hpipe::CharItem>(ostream *os,CharItem *val,int lim)

{
  ostream *poVar1;
  ostringstream ss;
  char *local_1b8 [4];
  ostringstream local_198 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  CharItem::write_to_stream(val,(ostream *)local_198);
  std::__cxx11::stringbuf::str();
  poVar1 = dot_out(os,local_1b8[0],lim);
  std::__cxx11::string::~string((string *)local_1b8);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return poVar1;
}

Assistant:

std::ostream &dot_out( std::ostream &os, const T &val, int lim = -1 ) {
    std::ostringstream ss;
    ss << val;
    return dot_out( os, ss.str().c_str(), lim );
}